

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake.cc
# Opt level: O1

UniquePtr<SSL_HANDSHAKE> bssl::ssl_handshake_new(SSL *ssl)

{
  SSL_CONFIG *pSVar1;
  bool bVar2;
  ssl_st *in_RSI;
  __uniq_ptr_data<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter,_true,_true> in_RDI;
  UniquePtr<SSL_HANDSHAKE> hs;
  _Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false> local_18;
  ssl_st *local_10;
  
  local_10 = in_RSI;
  local_18._M_head_impl = New<bssl::SSL_HANDSHAKE,ssl_st*&>(&local_10);
  if (local_18._M_head_impl != (SSL_HANDSHAKE *)0x0) {
    bVar2 = SSLTranscript::Init(&(local_18._M_head_impl)->transcript);
    if (bVar2) {
      pSVar1 = (local_10->config)._M_t.
               super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl;
      (local_18._M_head_impl)->config = pSVar1;
      if (pSVar1 == (SSL_CONFIG *)0x0) {
        __assert_fail("hs->config",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                      ,0x6a,"UniquePtr<SSL_HANDSHAKE> bssl::ssl_handshake_new(SSL *)");
      }
      *(SSL_HANDSHAKE **)
       in_RDI.super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl = local_18._M_head_impl;
      local_18._M_head_impl = (SSL_HANDSHAKE *)0x0;
      goto LAB_0024f4c5;
    }
  }
  *(undefined8 *)
   in_RDI.super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>._M_t.
   super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
   super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl = 0;
LAB_0024f4c5:
  std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter> *)&local_18);
  return (__uniq_ptr_data<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter,_true,_true>)
         (tuple<bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>)
         in_RDI.super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl;
}

Assistant:

UniquePtr<SSL_HANDSHAKE> ssl_handshake_new(SSL *ssl) {
  UniquePtr<SSL_HANDSHAKE> hs = MakeUnique<SSL_HANDSHAKE>(ssl);
  if (!hs || !hs->transcript.Init()) {
    return nullptr;
  }
  hs->config = ssl->config.get();
  if (!hs->config) {
    assert(hs->config);
    return nullptr;
  }
  return hs;
}